

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O3

void lyxml_free_attrs(ly_ctx *ctx,lyxml_elem *elem)

{
  lyxml_attr *plVar1;
  lyxml_attr *__ptr;
  
  if (elem != (lyxml_elem *)0x0) {
    __ptr = elem->attr;
    while (__ptr != (lyxml_attr *)0x0) {
      plVar1 = __ptr->next;
      lydict_remove(ctx,__ptr->name);
      lydict_remove(ctx,__ptr->value);
      free(__ptr);
      __ptr = plVar1;
    }
  }
  return;
}

Assistant:

void
lyxml_free_attrs(struct ly_ctx *ctx, struct lyxml_elem *elem)
{
    struct lyxml_attr *a, *next;
    if (!elem || !elem->attr) {
        return;
    }

    a = elem->attr;
    do {
        next = a->next;

        lydict_remove(ctx, a->name);
        lydict_remove(ctx, a->value);
        free(a);

        a = next;
    } while (a);
}